

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_resolve.cpp
# Opt level: O3

bool __thiscall BamTools::ResolveTool::StatsFileReader::Open(StatsFileReader *this,string *filename)

{
  char cVar1;
  
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::ifstream::close();
  }
  std::ifstream::open((char *)this,(_Ios_Openmode)(filename->_M_dataplus)._M_p);
  return *(int *)(&this->field_0x20 + *(long *)(*(long *)this + -0x18)) == 0;
}

Assistant:

bool ResolveTool::StatsFileReader::Open(const std::string& filename)
{

    // make sure stream is fresh
    Close();

    // attempt to open filename, return status
    m_stream.open(filename.c_str(), std::ifstream::in);
    return m_stream.good();
}